

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalize.cpp
# Opt level: O0

int __thiscall ncnn::Normalize::load_model(Normalize *this,ModelBin *mb)

{
  bool bVar1;
  long *in_RSI;
  long in_RDI;
  Mat *m;
  Mat *in_stack_ffffffffffffff98;
  Mat local_58;
  int local_4;
  
  m = &local_58;
  (**(code **)(*in_RSI + 0x10))(m,in_RSI,*(undefined4 *)(in_RDI + 200),1);
  Mat::operator=(in_stack_ffffffffffffff98,m);
  Mat::~Mat((Mat *)0x19ae6b);
  bVar1 = Mat::empty(m);
  if (bVar1) {
    local_4 = -100;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int Normalize::load_model(const ModelBin& mb)
{
    scale_data = mb.load(scale_data_size, 1);
    if (scale_data.empty())
        return -100;

    return 0;
}